

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlDebugDumpEntities(FILE *output,xmlDocPtr doc)

{
  xmlHashTablePtr pxVar1;
  xmlEntitiesTablePtr table_1;
  xmlEntitiesTablePtr table;
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_b0;
  
  if (output != (FILE *)0x0) {
    local_b0.depth = 0;
    local_b0.check = 0;
    local_b0.errors = 0;
    local_b0.nodict = 0;
    local_b0.options = 0;
    local_b0.doc = (xmlDocPtr)0x0;
    local_b0.node = (xmlNodePtr)0x0;
    local_b0.dict = (xmlDictPtr)0x0;
    builtin_strncpy(local_b0.shift,
                    "                                                                                                    "
                    ,0x65);
    if (doc != (xmlDocPtr)0x0) {
      local_b0.output = output;
      xmlCtxtDumpDocHead(&local_b0,doc);
      if ((doc->intSubset == (_xmlDtd *)0x0) ||
         (pxVar1 = (xmlHashTablePtr)doc->intSubset->entities, pxVar1 == (xmlHashTablePtr)0x0)) {
        fwrite("No entities in internal subset\n",0x1f,1,(FILE *)local_b0.output);
      }
      else {
        if (local_b0.check == 0) {
          fwrite("Entities in internal subset\n",0x1c,1,(FILE *)local_b0.output);
        }
        xmlHashScan(pxVar1,xmlCtxtDumpEntityCallback,&local_b0);
      }
      if ((doc->extSubset == (_xmlDtd *)0x0) ||
         (pxVar1 = (xmlHashTablePtr)doc->extSubset->entities, pxVar1 == (xmlHashTablePtr)0x0)) {
        if (local_b0.check == 0) {
          fwrite("No entities in external subset\n",0x1f,1,(FILE *)local_b0.output);
        }
      }
      else {
        if (local_b0.check == 0) {
          fwrite("Entities in external subset\n",0x1c,1,(FILE *)local_b0.output);
        }
        xmlHashScan(pxVar1,xmlCtxtDumpEntityCallback,&local_b0);
      }
    }
  }
  return;
}

Assistant:

void
xmlDebugDumpEntities(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL) return;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    xmlCtxtDumpEntities(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
}